

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O3

void substring_to_example(vw *all,example *ae,substring example)

{
  substring *psVar1;
  parser *ppVar2;
  char *pcVar3;
  char *pcVar4;
  char *endLine;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  substring s;
  TC_parser<true> parser_line;
  TC_parser<true> local_d0;
  
  endLine = example.end;
  pcVar5 = example.begin;
  (*(all->p->lp).default_label)(&ae->l);
  pcVar3 = pcVar5;
  pcVar7 = pcVar5;
  if (pcVar5 != endLine) {
    do {
      pcVar6 = pcVar5;
      pcVar4 = pcVar3;
      if (*pcVar3 == '|') break;
      pcVar3 = pcVar3 + 1;
      pcVar4 = endLine;
    } while (pcVar3 != endLine);
    for (; (pcVar3 = pcVar7, pcVar4 != pcVar6 && (pcVar7 = pcVar6, pcVar3 = pcVar4, *pcVar6 != '\t')
           ); pcVar6 = pcVar6 + 1) {
      pcVar7 = pcVar4;
    }
  }
  if (*pcVar5 == '|') {
    v_array<substring>::clear(&all->p->words);
  }
  else {
    pcVar6 = pcVar7 + 1;
    if (pcVar7 == pcVar3) {
      pcVar6 = pcVar5;
    }
    s.end = pcVar3;
    s.begin = pcVar6;
    tokenize<v_array<substring>>(' ',s,&all->p->words,false);
    ppVar2 = all->p;
    psVar1 = (ppVar2->words)._end;
    if ((psVar1 != (ppVar2->words)._begin) &&
       ((psVar1[-1].end == pcVar3 || (*psVar1[-1].begin == '\'')))) {
      (ppVar2->words)._end = psVar1 + -1;
      pcVar7 = psVar1[-1].begin + (*psVar1[-1].begin == '\'');
      push_many<char>(&ae->tag,pcVar7,(long)psVar1[-1].end - (long)pcVar7);
    }
  }
  ppVar2 = all->p;
  if ((ppVar2->words)._end != (ppVar2->words)._begin) {
    (*(ppVar2->lp).parse_label)(ppVar2,all->sd,&ae->l,&ppVar2->words);
  }
  if ((all->audit == false) && (all->hash_inv != true)) {
    TC_parser<false>::TC_parser((TC_parser<false> *)&local_d0,pcVar3,endLine,all,ae);
  }
  else {
    TC_parser<true>::TC_parser(&local_d0,pcVar3,endLine,all,ae);
  }
  return;
}

Assistant:

void substring_to_example(vw* all, example* ae, substring example)
{
  all->p->lp.default_label(&ae->l);
  char* bar_location = safe_index(example.begin, '|', example.end);
  char* tab_location = safe_index(example.begin, '\t', bar_location);
  substring label_space;
  if (tab_location != bar_location)
  {
    label_space.begin = tab_location + 1;
  }
  else
  {
    label_space.begin = example.begin;
  }
  label_space.end = bar_location;

  if (*example.begin == '|')
  {
    all->p->words.clear();
  }
  else
  {
    tokenize(' ', label_space, all->p->words);
    if (all->p->words.size() > 0 &&
        (all->p->words.last().end == label_space.end ||
            *(all->p->words.last().begin) == '\''))  // The last field is a tag, so record and strip it off
    {
      substring tag = all->p->words.pop();
      if (*tag.begin == '\'')
        tag.begin++;
      push_many(ae->tag, tag.begin, tag.end - tag.begin);
    }
  }

  if (all->p->words.size() > 0)
    all->p->lp.parse_label(all->p, all->sd, &ae->l, all->p->words);

  if (all->audit || all->hash_inv)
    TC_parser<true> parser_line(bar_location, example.end, *all, ae);
  else
    TC_parser<false> parser_line(bar_location, example.end, *all, ae);
}